

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

ValueType * __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<1>::find_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,pair<int,_int> *key)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  int in_R11D;
  int iVar9;
  undefined1 auVar8 [16];
  
  uVar3 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar5 = uVar3 >> 10;
  uVar4 = (this->occupation).occupation;
  if ((uVar4 >> (uVar5 & 0x3f) & 1) != 0) {
    lVar7 = POPCOUNT(uVar4 >> ((byte)uVar5 & 0x3f));
    uVar3 = uVar3 & 0xffff;
    iVar9 = (int)lVar7;
    iVar6 = iVar9 + -2;
    lVar7 = (lVar7 << 0x20) + -0x200000000;
    uVar4 = (ulong)(uint)(iVar9 * 8);
    do {
      uVar5 = uVar4 + 8;
      iVar6 = iVar6 + 1;
      lVar7 = lVar7 + 0x100000000;
      lVar2 = uVar4 - 8;
      uVar4 = uVar5;
    } while (uVar3 < *(ulong *)((long)(this->hashes)._M_elems + lVar2));
    iVar6 = this->size - iVar6;
    if (iVar6 != 0) {
      while( true ) {
        if (*(ulong *)((long)(this->hashes)._M_elems + (uVar5 - 0x10)) != uVar3) {
          return (ValueType *)0x0;
        }
        uVar1 = *(undefined8 *)((long)(this->hashes)._M_elems + uVar5 * 2 + 0x18);
        auVar8._0_4_ = -(uint)((int)uVar1 == (*key).first);
        iVar9 = -(uint)((int)((ulong)uVar1 >> 0x20) == (*key).second);
        auVar8._4_4_ = auVar8._0_4_;
        auVar8._8_4_ = iVar9;
        auVar8._12_4_ = iVar9;
        in_R11D = movmskpd(in_R11D,auVar8);
        if (in_R11D == 3) break;
        lVar7 = lVar7 + 0x100000000;
        uVar5 = uVar5 + 8;
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          return (ValueType *)0x0;
        }
      }
      return (ValueType *)((long)&(this->entries)._M_elems[0].value_ + (lVar7 >> 0x1c));
    }
  }
  return (ValueType *)0x0;
}

Assistant:

ValueType* find_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return nullptr;

      int pos = occupation.num_set_until(hashChunk) - 1;
      while (hashes[pos] > hash) ++pos;

      if (find_key(key, hash, pos)) return &entries[pos].value();

      return nullptr;
    }